

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O1

void __thiscall
spvtools::opt::VectorDCE::AddItemToWorkListIfNeeded
          (VectorDCE *this,WorkListItem *work_item,LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  Instruction *this_00;
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  uint32_t local_40 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  this_00 = work_item->instruction;
  uVar3 = 0;
  if (this_00->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
  }
  uVar1 = (live_components->_M_h)._M_bucket_count;
  uVar4 = (ulong)uVar3 % uVar1;
  p_Var6 = (live_components->_M_h)._M_buckets[uVar4];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var5 = p_Var6->_M_nxt, p_Var7 = p_Var6, uVar3 != *(uint *)&p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var5, p_Var5 = p_Var6->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var7 = p_Var6, uVar3 == *(uint *)&p_Var5[1]._M_nxt)) goto LAB_001b825a;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_001b825a:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var5 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var5 = p_Var7->_M_nxt;
  }
  if (p_Var5 == (_Hash_node_base *)0x0) {
    local_40[0] = 0;
    if (this_00->has_result_id_ == true) {
      local_40[0] = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_38,&(work_item->components).bits_);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int,spvtools::utils::BitVector>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::utils::BitVector>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)live_components,local_40);
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    bVar2 = utils::BitVector::Or((BitVector *)(p_Var5 + 2),&work_item->components);
    if (!bVar2) {
      return;
    }
  }
  std::
  vector<spvtools::opt::VectorDCE::WorkListItem,std::allocator<spvtools::opt::VectorDCE::WorkListItem>>
  ::emplace_back<spvtools::opt::VectorDCE::WorkListItem&>
            ((vector<spvtools::opt::VectorDCE::WorkListItem,std::allocator<spvtools::opt::VectorDCE::WorkListItem>>
              *)work_list,work_item);
  return;
}

Assistant:

void VectorDCE::AddItemToWorkListIfNeeded(
    WorkListItem work_item, VectorDCE::LiveComponentMap* live_components,
    std::vector<WorkListItem>* work_list) {
  Instruction* current_inst = work_item.instruction;
  auto it = live_components->find(current_inst->result_id());
  if (it == live_components->end()) {
    live_components->emplace(
        std::make_pair(current_inst->result_id(), work_item.components));
    work_list->emplace_back(work_item);
  } else {
    if (it->second.Or(work_item.components)) {
      work_list->emplace_back(work_item);
    }
  }
}